

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

size_t __thiscall sentencepiece::NormalizerSpec::ByteSizeLong(NormalizerSpec *this)

{
  uint uVar1;
  int size;
  string *psVar2;
  size_t sVar3;
  InternalMetadata *this_00;
  long lVar4;
  int cached_size;
  uint32 cached_has_bits;
  size_t total_size;
  NormalizerSpec *this_local;
  
  _cached_size = google::protobuf::internal::ExtensionSet::ByteSize(&this->_extensions_);
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar2 = _internal_name_abi_cxx11_(this);
      sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar2);
      _cached_size = sVar3 + 1 + _cached_size;
    }
    if ((uVar1 & 2) != 0) {
      psVar2 = _internal_precompiled_charsmap_abi_cxx11_(this);
      sVar3 = google::protobuf::internal::WireFormatLite::BytesSize(psVar2);
      _cached_size = sVar3 + 1 + _cached_size;
    }
    if ((uVar1 & 4) != 0) {
      psVar2 = _internal_normalization_rule_tsv_abi_cxx11_(this);
      sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar2);
      _cached_size = sVar3 + 1 + _cached_size;
    }
    if ((uVar1 & 8) != 0) {
      _cached_size = _cached_size + 2;
    }
    if ((uVar1 & 0x10) != 0) {
      _cached_size = _cached_size + 2;
    }
    if ((uVar1 & 0x20) != 0) {
      _cached_size = _cached_size + 2;
    }
  }
  if (((uint)(this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 1) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    if (((uint)this_00->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (this_00);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    lVar4 = std::__cxx11::string::size();
    _cached_size = lVar4 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t NormalizerSpec::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:sentencepiece.NormalizerSpec)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000003fu) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional bytes precompiled_charsmap = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::BytesSize(
          this->_internal_precompiled_charsmap());
    }

    // optional string normalization_rule_tsv = 6;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_normalization_rule_tsv());
    }

    // optional bool add_dummy_prefix = 3 [default = true];
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 + 1;
    }

    // optional bool remove_extra_whitespaces = 4 [default = true];
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 + 1;
    }

    // optional bool escape_whitespaces = 5 [default = true];
    if (cached_has_bits & 0x00000020u) {
      total_size += 1 + 1;
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}